

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_CreateWithAlias_Test::TestBody(PKCS12Test_CreateWithAlias_Test *this)

{
  bool bVar1;
  int iVar2;
  X509 *x;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar3;
  pointer *__ptr;
  UniquePtr<EVP_PKEY> UVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  initializer_list<x509_st_*> __l;
  AssertHelper local_108;
  UniquePtr<PKCS12> p12;
  AssertionResult gtest_ar_;
  EVP_PKEY *parsed_key;
  AssertionResult gtest_ar__3;
  UniquePtr<BIO> bio;
  vector<unsigned_char,_std::allocator<unsigned_char>_> der;
  UniquePtr<X509> delete_cert;
  UniquePtr<EVP_PKEY> delete_key;
  vector<x509_st_*,_std::allocator<x509_st_*>_> certs;
  X509 *parsed_cert;
  UniquePtr<X509> cert1;
  UniquePtr<EVP_PKEY> key;
  int alias_len;
  UniquePtr<X509> cert2;
  string alias;
  AssertHelper local_30;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  stack_st_X509 *ca_certs;
  int res;
  
  MakeTestKey();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&certs);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&alias,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&der,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x260,alias._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&der,(Message *)&certs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&der);
    std::__cxx11::string::~string((string *)&alias);
    if ((long *)CONCAT44(certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_0030012f;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  MakeTestCert((EVP_PKEY *)&cert1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&certs);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&alias,(internal *)&gtest_ar_,(AssertionResult *)"cert1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&der,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x262,alias._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&der,(Message *)&certs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&der);
    std::__cxx11::string::~string((string *)&alias);
    if ((long *)CONCAT44(certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    MakeTestCert((EVP_PKEY *)&cert2);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&certs);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&alias,(internal *)&gtest_ar_,(AssertionResult *)"cert2","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&der,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x264,alias._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&der,(Message *)&certs);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&der);
      std::__cxx11::string::~string((string *)&alias);
      if ((long *)CONCAT44(certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(certs.
                                       super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       certs.
                                       super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&alias,"I\'m an alias",(allocator<char> *)&gtest_ar_);
      res = X509_alias_set1((X509 *)cert1._M_t.
                                    super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                            (uchar *)alias._M_dataplus._M_p,(int)alias._M_string_length);
      certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar_,"res","1",&res,(int *)&certs);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&certs);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&der,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x26a,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&der,(Message *)&certs);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&der);
        if ((long *)CONCAT44(certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl
                             .super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(certs.
                                         super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         certs.
                                         super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_._0_8_ =
             cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l._M_len = 2;
        __l._M_array = (iterator)&gtest_ar_;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  (&certs,__l,(allocator_type *)&der);
        der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar1 = PKCS12CreateVector(&der,(EVP_PKEY *)
                                        key._M_t.
                                        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                   &certs);
        gtest_ar__3.success_ = bVar1;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__3.message_);
          bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
               BIO_new_mem_buf(der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (int)der.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                               (int)der.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__3.success_ =
               (tuple<bio_st_*,_bssl::internal::Deleter>)
               bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_bio_st_*,_false>)0x0;
          if ((tuple<bio_st_*,_bssl::internal::Deleter>)
              bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_bio_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&p12);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__3,(AssertionResult *)0x5104cb,
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&parsed_key,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x271,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_key,(Message *)&p12);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_key);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            if ((__uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>)
                p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)p12._M_t.
                                    super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__3.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__3.message_);
            p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<pkcs12_st,_bssl::internal::Deleter,_true,_true>)
                 d2i_PKCS12_bio((BIO *)bio._M_t.
                                       super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                                (PKCS12 **)0x0);
            gtest_ar__3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__3.success_ =
                 (tuple<pkcs12_st_*,_bssl::internal::Deleter>)
                 p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_pkcs12_st_*,_false>)0x0;
            if ((tuple<pkcs12_st_*,_bssl::internal::Deleter>)
                p12._M_t.super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_pkcs12_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&parsed_key);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__3,(AssertionResult *)0x4d6f15,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&parsed_cert,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x273,(char *)gtest_ar_._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&parsed_cert,(Message *)&parsed_key);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_cert);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              UVar4._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)parsed_key;
LAB_002fff69:
              if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
                  UVar4._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
                (**(code **)(*(long *)UVar4._M_t.
                                      super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 8)
                )();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__3.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__3.message_);
              parsed_key = (EVP_PKEY *)0x0;
              parsed_cert = (X509 *)0x0;
              ca_certs = (stack_st_X509 *)0x0;
              iVar2 = PKCS12_parse((PKCS12 *)
                                   p12._M_t.
                                   super___uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl,"foo",
                                   (EVP_PKEY **)&parsed_key,(X509 **)&parsed_cert,
                                   (stack_st_X509 **)&ca_certs);
              gtest_ar__3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__3.success_ = iVar2 != 0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&delete_key);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                           (AssertionResult *)
                           "PKCS12_parse(p12.get(), kPassword, &parsed_key, &parsed_cert, &ca_certs)"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&delete_cert,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x279,(char *)gtest_ar_._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&delete_cert,(Message *)&delete_key);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&delete_cert);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                UVar4 = delete_key;
                goto LAB_002fff69;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__3.message_);
              delete_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)parsed_key;
              delete_cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)parsed_cert;
              delete_ca_certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
                   (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)ca_certs;
              gtest_ar__3._0_8_ = OPENSSL_sk_num((OPENSSL_STACK *)ca_certs);
              local_108.data_ = (AssertHelperData *)0x1;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                        ((internal *)&gtest_ar_,"sk_X509_num(ca_certs)","1UL",
                         (unsigned_long *)&gtest_ar__3,(unsigned_long *)&local_108);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__3);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = *(char **)gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x27e,pcVar5);
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&gtest_ar__3);
                this_00 = &gtest_ar_.message_;
                testing::internal::AssertHelper::~AssertHelper(&local_108);
                if (gtest_ar__3._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
                }
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                alias_len = 0;
                x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ca_certs,0);
                tVar3.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )X509_alias_get0(x,&alias_len);
                this_00 = &gtest_ar__3.message_;
                gtest_ar__3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__3.success_ =
                     tVar3.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl !=
                     (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      )0x0;
                if (tVar3.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                    (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     )0x0) {
                  testing::Message::Message((Message *)&local_108);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                             (AssertionResult *)"parsed_alias","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_30,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x283,(char *)gtest_ar_._0_8_);
                  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_108);
                  testing::internal::AssertHelper::~AssertHelper(&local_30);
                  std::__cxx11::string::~string((string *)&gtest_ar_);
                  if (local_108.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_108.data_ + 8))();
                  }
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(this_00);
                  gtest_ar__3._0_8_ = SEXT48(alias_len);
                  gtest_ar__3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )tVar3.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
                  testing::internal::
                  CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                            ((internal *)&gtest_ar_,"alias",
                             "bssl::BytesAsStringView(bssl::Span(parsed_alias, alias_len))",&alias,
                             (basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__3);
                  if (gtest_ar_.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar__3);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = *(char **)gtest_ar_.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_108,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x285,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_108,(Message *)&gtest_ar__3);
                    testing::internal::AssertHelper::~AssertHelper(&local_108);
                    if (gtest_ar__3._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
                    }
                  }
                  this_00 = &gtest_ar_.message_;
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(this_00);
              std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&delete_ca_certs)
              ;
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&delete_cert);
              std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&delete_key);
            }
            std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr(&p12);
          }
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio);
        }
        else {
          testing::Message::Message((Message *)&bio);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                     (AssertionResult *)"PKCS12CreateVector(&der, key.get(), certs)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&p12,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x26e,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&p12,(Message *)&bio);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p12);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
              bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__3.message_);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  (&certs.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>);
      }
      std::__cxx11::string::~string((string *)&alias);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert2);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert1);
LAB_0030012f:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(PKCS12Test, CreateWithAlias) {
  bssl::UniquePtr<EVP_PKEY> key = MakeTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key.get());
  ASSERT_TRUE(cert2);

  std::string alias = "I'm an alias";
  int res = X509_alias_set1(
      cert1.get(), reinterpret_cast<const unsigned char *>(alias.data()),
      alias.size());
  ASSERT_EQ(res, 1);

  std::vector<X509 *> certs = {cert1.get(), cert2.get()};
  std::vector<uint8_t> der;
  ASSERT_TRUE(PKCS12CreateVector(&der, key.get(), certs));

  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(der.data(), der.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<PKCS12> p12(d2i_PKCS12_bio(bio.get(), nullptr));
  ASSERT_TRUE(p12);

  EVP_PKEY *parsed_key = nullptr;
  X509 *parsed_cert = nullptr;
  STACK_OF(X509) *ca_certs = nullptr;
  ASSERT_TRUE(
      PKCS12_parse(p12.get(), kPassword, &parsed_key, &parsed_cert, &ca_certs));

  bssl::UniquePtr<EVP_PKEY> delete_key(parsed_key);
  bssl::UniquePtr<X509> delete_cert(parsed_cert);
  bssl::UniquePtr<STACK_OF(X509)> delete_ca_certs(ca_certs);
  ASSERT_EQ(sk_X509_num(ca_certs), 1UL);

  int alias_len = 0;
  const unsigned char *parsed_alias =
      X509_alias_get0(sk_X509_value(ca_certs, 0), &alias_len);
  ASSERT_TRUE(parsed_alias);
  ASSERT_EQ(alias,
            bssl::BytesAsStringView(bssl::Span(parsed_alias, alias_len)));
}